

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMarshall.c
# Opt level: O3

JL_STATUS MarshallDictionary(void *Structure,JlMarshallElement *StructDescription,
                            size_t StructDescriptionCount,JlDataObject *DictionaryObject)

{
  JlMarshallElement *Description;
  void *pvVar1;
  JL_STATUS JVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  undefined8 *Input;
  ulong uVar6;
  JlDataObject *childDictionary;
  JlDataObject *newListObject;
  JlDataObject *local_60;
  JlDataObject *local_58;
  JlDataObject *local_50;
  size_t local_48;
  void *local_40;
  JlMarshallElement *local_38;
  
  if (StructDescriptionCount == 0) {
    JVar2 = JL_STATUS_SUCCESS;
  }
  else {
    uVar5 = 0;
    local_50 = DictionaryObject;
    local_48 = StructDescriptionCount;
    local_40 = Structure;
    local_38 = StructDescription;
    do {
      pvVar1 = local_40;
      Description = local_38 + uVar5;
      Input = (undefined8 *)(local_38[uVar5].FieldOffset + (long)local_40);
      if (local_38[uVar5].IsArray == true) {
        sVar3 = JlMemoryReadCountValue
                          ((void *)(Description->CountFieldOffset + (long)local_40),
                           Description->CountFieldSize);
        RemoveExistingObjectFromDictionary(DictionaryObject,Description->Name);
        local_58 = (JlDataObject *)0x0;
        if (Description->ArrayFieldSize == 0) {
          Input = (undefined8 *)*Input;
        }
        JVar2 = JlCreateObject(JL_DATA_TYPE_LIST,&local_58);
        StructDescriptionCount = local_48;
        if (JVar2 == JL_STATUS_SUCCESS) {
          if (sVar3 != 0) {
            uVar6 = 0;
            do {
              local_60 = (JlDataObject *)0x0;
              JVar2 = MarshallObject((undefined8 *)
                                     (Description->ArrayItemSize * uVar6 + (long)Input),Description,
                                     &local_60);
              StructDescriptionCount = local_48;
              DictionaryObject = local_50;
              if (JVar2 != JL_STATUS_SUCCESS) goto LAB_00105185;
              JVar2 = JlAttachObjectToListObject(local_58,local_60);
              uVar6 = uVar6 + 1;
            } while ((uVar6 < sVar3) && (JVar2 == JL_STATUS_SUCCESS));
            StructDescriptionCount = local_48;
            DictionaryObject = local_50;
            if (JVar2 != JL_STATUS_SUCCESS) goto LAB_00105185;
          }
          JVar2 = JlAttachObjectToDictionaryObject(DictionaryObject,Description->Name,local_58);
          StructDescriptionCount = local_48;
        }
      }
      else if (Description->Type == JL_DATA_TYPE_DICTIONARY) {
        local_60 = (JlDataObject *)0x0;
        JVar2 = JlGetObjectFromDictionaryByKey(DictionaryObject,Description->Name,&local_60);
        if (JVar2 == JL_STATUS_NOT_FOUND) {
          JVar2 = JlCreateObject(JL_DATA_TYPE_DICTIONARY,&local_60);
          if (JVar2 != JL_STATUS_SUCCESS) goto LAB_00105185;
          JVar2 = JlAttachObjectToDictionaryObject(DictionaryObject,Description->Name,local_60);
        }
        if (JVar2 == JL_STATUS_SUCCESS) {
          JVar2 = MarshallDictionary(Input,Description->ChildStructDescription,
                                     (ulong)Description->ChildStructDescriptionCount,local_60);
        }
      }
      else {
        RemoveExistingObjectFromDictionary(DictionaryObject,Description->Name);
        local_58 = (JlDataObject *)0x0;
        if (Description->IsBase64 == true) {
          if (Description->CountFieldOffset == 0) {
            sVar3 = Description->FieldSize;
            if (sVar3 == 0) {
LAB_00105197:
              JVar2 = JlCreateObject(JL_DATA_TYPE_STRING,&local_58);
              goto LAB_0010516e;
            }
          }
          else {
            sVar4 = JlMemoryReadCountValue
                              ((void *)(Description->CountFieldOffset + (long)pvVar1),
                               Description->CountFieldSize);
            sVar3 = Description->FieldSize;
            if (Description->FieldSize == 0) {
              if (sVar4 == 0) goto LAB_00105197;
              Input = (undefined8 *)*Input;
              sVar3 = sVar4;
            }
          }
          local_60 = (JlDataObject *)0x0;
          JVar2 = JlBase64Encode(Input,sVar3,(char **)&local_60);
          if (JVar2 == JL_STATUS_SUCCESS) {
            JVar2 = JlCreateObject(JL_DATA_TYPE_STRING,&local_58);
            if (JVar2 == JL_STATUS_SUCCESS) {
              JVar2 = JlSetObjectString(local_58,(char *)local_60);
            }
            WjTestLib_Free(local_60);
          }
        }
        else {
          JVar2 = MarshallObject(Input,Description,&local_58);
        }
LAB_0010516e:
        if (JVar2 == JL_STATUS_SUCCESS) {
          JVar2 = JlAttachObjectToDictionaryObject(DictionaryObject,Description->Name,local_58);
        }
      }
LAB_00105185:
      uVar5 = (ulong)((int)uVar5 + 1);
    } while ((uVar5 < StructDescriptionCount) && (JVar2 == JL_STATUS_SUCCESS));
  }
  return JVar2;
}

Assistant:

static
JL_STATUS
    MarshallDictionary
    (
        void const*                 Structure,
        JlMarshallElement const*    StructDescription,
        size_t                      StructDescriptionCount,
        JlDataObject*               DictionaryObject
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;

    for( uint32_t i=0; i<StructDescriptionCount && JL_STATUS_SUCCESS==jlStatus; i++ )
    {
        JlMarshallElement const* currentItem = &StructDescription[i];
        void const* elementInStruct = (void*)(((uint8_t*)Structure)+currentItem->FieldOffset);

        if( currentItem->IsArray )
        {
            void const* countFieldPtr = ((uint8_t*)Structure) + currentItem->CountFieldOffset;
            size_t countValue = JlMemoryReadCountValue( countFieldPtr, currentItem->CountFieldSize );

            // Remove the list from the DictionaryObject if it already exists, as we will replace it with our
            // new object for our new list
            RemoveExistingObjectFromDictionary( DictionaryObject, currentItem->Name );

            // Marshall new list object
            JlDataObject* newListObject = NULL;
            jlStatus = MarshallList( elementInStruct, countValue, currentItem, &newListObject );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Attach the object to the dictionary
                jlStatus = JlAttachObjectToDictionaryObject( DictionaryObject, currentItem->Name, newListObject );
            }
        }
        else if( JL_DATA_TYPE_DICTIONARY == currentItem->Type )
        {
            // Dictionary within this dictionary. We treat this a bit differently from other objects as we
            // will allow existing items in the dictionary to remain if they are already there and not
            // referenced by the Description.

            // Get or create a new dictionary.
            JlDataObject* childDictionary = NULL;
            jlStatus = JlGetObjectFromDictionaryByKey( DictionaryObject, currentItem->Name, &childDictionary );
            if( JL_STATUS_NOT_FOUND == jlStatus )
            {
                // Create a new dictionary and attach it.
                jlStatus = JlCreateObject( JL_DATA_TYPE_DICTIONARY, &childDictionary );
                if( JL_STATUS_SUCCESS == jlStatus )
                {
                    jlStatus = JlAttachObjectToDictionaryObject( DictionaryObject, currentItem->Name, childDictionary );
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // childDictionary is the new dictionary we are going to marshall into.
                jlStatus = MarshallDictionary( elementInStruct, currentItem->ChildStructDescription, currentItem->ChildStructDescriptionCount, childDictionary );
            }
        }
        else
        {
            // Remove the item from the DictionaryObject if it already exists, as we will replace it with our
            // new object
            RemoveExistingObjectFromDictionary( DictionaryObject, currentItem->Name );

            // Marshall new object.
            JlDataObject* newObject = NULL;
            if( currentItem->IsBase64 )
            {
                size_t sizeValue = 0;
                if( currentItem->CountFieldOffset )
                {
                    void const* sizeFieldPtr = ((uint8_t*)Structure) + currentItem->CountFieldOffset;
                    sizeValue = JlMemoryReadCountValue( sizeFieldPtr, currentItem->CountFieldSize );
                }
                jlStatus = MarshalBinaryData( elementInStruct, sizeValue, currentItem, &newObject );
            }
            else
            {
                jlStatus = MarshallObject( elementInStruct, currentItem, &newObject );
            }
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Attach the object to the dictionary
                jlStatus = JlAttachObjectToDictionaryObject( DictionaryObject, currentItem->Name, newObject );
            }
        }
    }

    return jlStatus;
}